

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

void __thiscall
HighsMipSolverData::runPresolve(HighsMipSolverData *this,HighsInt presolve_reduction_limit)

{
  bool bVar1;
  HighsModelStatus HVar2;
  HighsMipSolver *pHVar3;
  HPresolve presolve;
  HPresolve local_6e0;
  
  HighsTimer::start(&this->mipsolver->timer_,(this->mipsolver->timer_).presolve_clock);
  local_6e0.mipsolver = (HighsMipSolver *)0x0;
  memset(&local_6e0.impliedDualRowBounds,0,0xc0);
  memset(&local_6e0.Avalue,0,0x348);
  local_6e0.changedRowIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.changedRowIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.changedRowIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.changedRowFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.changedRowFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.changedRowFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.changedColIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.changedColIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.changedColIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.changedColFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.changedColFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.changedColFlag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.substitutionOpportunities.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.substitutionOpportunities.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.substitutionOpportunities.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.liftingOpportunities._M_h._M_bucket_count = 1;
  local_6e0.liftingOpportunities._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_6e0.liftingOpportunities._M_h._M_element_count = 0;
  local_6e0.liftingOpportunities._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_6e0.liftingOpportunities._M_h._M_rehash_policy._M_next_resize = 0;
  local_6e0.liftingOpportunities._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_header;
  local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_6e0.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_6e0.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_6e0.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_6e0.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_6e0.analysis_.allow_rule_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_6e0.analysis_.presolve_log_.rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.analysis_.presolve_log_.rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.analysis_.presolve_log_.rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.eqiters.
  super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.eqiters.
  super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_6e0.eqiters.
  super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.numProbes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.numProbes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.numProbes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.colDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.colDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.rowDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.colDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.rowDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.rowDeleted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.singletonColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.singletonColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.singletonRows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.singletonColumns.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.singletonRows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.singletonRows.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.liftingOpportunities._M_h._M_buckets =
       &local_6e0.liftingOpportunities._M_h._M_single_bucket;
  local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_6e0.equations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = ::presolve::HPresolve::okSetInput(&local_6e0,this->mipsolver,presolve_reduction_limit);
  if (bVar1) {
    HVar2 = ::presolve::HPresolve::run(&local_6e0,&this->postSolveStack);
    pHVar3 = this->mipsolver;
    pHVar3->modelstatus_ = HVar2;
  }
  else {
    pHVar3 = this->mipsolver;
    pHVar3->modelstatus_ = kMax;
    local_6e0.presolve_status_ = kOutOfMemory;
  }
  this->presolve_status = local_6e0.presolve_status_;
  HighsTimer::stop(&pHVar3->timer_,(pHVar3->timer_).presolve_clock);
  ::presolve::HPresolve::~HPresolve(&local_6e0);
  return;
}

Assistant:

void HighsMipSolverData::runPresolve(const HighsInt presolve_reduction_limit) {
#ifdef HIGHS_DEBUGSOL
  bool debugSolActive = false;
  std::swap(debugSolution.debugSolActive, debugSolActive);
#endif

  mipsolver.timer_.start(mipsolver.timer_.presolve_clock);
  presolve::HPresolve presolve;
  if (!presolve.okSetInput(mipsolver, presolve_reduction_limit)) {
    mipsolver.modelstatus_ = HighsModelStatus::kMemoryLimit;
    presolve_status = HighsPresolveStatus::kOutOfMemory;
  } else {
    mipsolver.modelstatus_ = presolve.run(postSolveStack);
    presolve_status = presolve.getPresolveStatus();
  }
  mipsolver.timer_.stop(mipsolver.timer_.presolve_clock);

#ifdef HIGHS_DEBUGSOL
  debugSolution.debugSolActive = debugSolActive;
  if (debugSolution.debugSolActive) debugSolution.registerDomain(domain);
  assert(!debugSolution.debugSolActive ||
         checkSolution(debugSolution.debugSolution));
#endif
}